

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.hh
# Opt level: O3

optional<tinyusdz::Token> * __thiscall
tinyusdz::crate::CrateValue::get_value<tinyusdz::Token>
          (optional<tinyusdz::Token> *__return_storage_ptr__,CrateValue *this)

{
  undefined8 *puVar1;
  optional<tinyusdz::Token> local_38;
  
  tinyusdz::value::Value::get_value<tinyusdz::Token>(&local_38,&this->value_,false);
  __return_storage_ptr__->has_value_ = local_38.has_value_;
  if (local_38.has_value_ == true) {
    puVar1 = (undefined8 *)((long)&__return_storage_ptr__->contained + 0x10);
    *(undefined8 **)&__return_storage_ptr__->contained = puVar1;
    if (local_38.contained.data.__align ==
        (anon_struct_8_0_00000001_for___align)((long)&local_38.contained + 0x10)) {
      *puVar1 = local_38.contained._16_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = local_38.contained._24_8_;
    }
    else {
      *(anon_struct_8_0_00000001_for___align *)&__return_storage_ptr__->contained =
           local_38.contained.data.__align;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = local_38.contained._16_8_;
    }
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = local_38.contained._8_8_;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return value_.get_value<T>();
  }